

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O2

int GMRES<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,TPZFMatrix<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *H,int *m,int64_t *max_iter,
              double *tol,TPZFMatrix<long_double> *residual,int FromCurrent)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  TPZFMatrix<long_double> *pTVar3;
  long lVar4;
  int64_t iVar5;
  longdouble *plVar6;
  longdouble *plVar7;
  ostream *poVar8;
  int iVar9;
  TPZFMatrix<long_double> *pTVar10;
  TPZFMatrix<long_double> *pTVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  TPZFMatrix<long_double> *B;
  long lVar15;
  ulong uVar16;
  TPZFMatrix<long_double> *this;
  ulong uVar17;
  long row;
  bool bVar18;
  longdouble in_ST0;
  longdouble lVar19;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar20;
  longdouble in_ST6;
  longdouble lVar21;
  longdouble in_ST7;
  longdouble lVar22;
  ulong uVar23;
  double dVar24;
  double local_480;
  double local_478;
  TPZFMatrix<long_double> w;
  TPZFMatrix<long_double> s;
  TPZFMatrix<long_double> sn;
  TPZFMatrix<long_double> cs;
  TPZFMatrix<long_double> w1;
  TPZFMatrix<long_double> resbackup;
  
  TPZFMatrix<long_double>::TPZFMatrix(&s,(long)*m + 1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&cs,(long)*m + 1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&sn,(long)*m + 1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&w1);
  TPZFMatrix<long_double>::TPZFMatrix(&w);
  TPZFMatrix<long_double>::TPZFMatrix(&resbackup);
  this = residual;
  if (residual == (TPZFMatrix<long_double> *)0x0) {
    this = &resbackup;
  }
  pTVar10 = b;
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,b,this,0);
  Norm((longdouble *)this,pTVar10);
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(this,b);
  }
  else {
    in_ST7 = in_ST6;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,this,0);
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,this,&w,0);
  pTVar10 = &w;
  TPZFMatrix<long_double>::operator=(this,pTVar10);
  lVar20 = in_ST7;
  Norm((longdouble *)this,pTVar10);
  local_478 = (double)in_ST1;
  lVar19 = lVar20;
  Norm((longdouble *)this,pTVar10);
  uVar23 = -(ulong)((double)in_ST0 == 0.0);
  dVar24 = (double)(~uVar23 & (ulong)(double)in_ST0 | uVar23 & 0x3ff0000000000000);
  local_480 = (double)in_ST2 / dVar24;
  if (local_480 <= *tol) {
    *tol = local_480;
    TPZFMatrix<long_double>::operator+=(x,&this->super_TPZMatrix<long_double>);
    *max_iter = 0;
  }
  else {
    iVar9 = *m;
    uVar17 = (ulong)(iVar9 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar17;
    uVar23 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x90),8) == 0) {
      uVar23 = SUB168(auVar1 * ZEXT816(0x90),0) | 8;
    }
    puVar2 = (ulong *)operator_new__(uVar23);
    *puVar2 = uVar17;
    pTVar10 = (TPZFMatrix<long_double> *)(puVar2 + 1);
    if (iVar9 + 1 != 0) {
      lVar12 = 0;
      pTVar3 = pTVar10;
      do {
        TPZFMatrix<long_double>::TPZFMatrix(pTVar3);
        lVar12 = lVar12 + -0x90;
        pTVar3 = pTVar3 + 1;
      } while (uVar17 * -0x90 - lVar12 != 0);
    }
    pTVar3 = &resbackup;
    if (residual != (TPZFMatrix<long_double> *)0x0) {
      pTVar3 = residual;
    }
    lVar12 = 1;
    do {
      lVar13 = 1;
      if (*max_iter < lVar12) {
        *tol = local_480;
        uVar17 = *puVar2 * 0x90;
        uVar23 = uVar17 + 8;
        uVar16 = *puVar2;
        while (uVar16 != 0) {
          TPZFMatrix<long_double>::~TPZFMatrix
                    ((TPZFMatrix<long_double> *)((long)puVar2 + (uVar17 - 0x88)));
          uVar17 = uVar17 - 0x90;
          uVar16 = uVar17;
        }
        operator_delete__(puVar2,uVar23);
        iVar9 = 1;
        goto LAB_00cfef48;
      }
      lVar14 = (pTVar3->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
      (*(pTVar10->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xd])(pTVar10,lVar14,1);
      if (lVar14 < 1) {
        lVar14 = 0;
      }
      lVar4 = 0;
      while (bVar18 = lVar14 != 0, lVar14 = lVar14 + -1, bVar18) {
        *(longdouble *)(puVar2[5] + lVar4) =
             (longdouble)((double)*(longdouble *)((long)pTVar3->fElem + lVar4) * (1.0 / local_478));
        lVar4 = lVar4 + 0x10;
      }
      iVar5 = s.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
      if (s.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow < 1) {
        iVar5 = 0;
      }
      plVar6 = s.fElem;
      lVar21 = lVar19;
      while (bVar18 = iVar5 != 0, iVar5 = iVar5 + -1, bVar18) {
        *plVar6 = (longdouble)0;
        plVar6 = plVar6 + 1;
        lVar21 = lVar20;
      }
      *s.fElem = (longdouble)local_478;
      lVar14 = 0;
LAB_00cfea5f:
      if ((lVar14 < *m) && (lVar12 <= *max_iter)) {
        lVar22 = lVar21;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
                  (A,pTVar10 + lVar14,&w1,0);
        pTVar11 = &w1;
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,pTVar11,&w,0);
        B = pTVar10;
        lVar19 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        in_ST7 = lVar20;
        lVar20 = lVar21;
        lVar21 = lVar22;
        for (lVar4 = 0; lVar13 != lVar4; lVar4 = lVar4 + 1) {
          Dot<long_double>(&w,B);
          plVar6 = TPZFMatrix<long_double>::operator()(H,lVar4,lVar14);
          *plVar6 = lVar19;
          plVar6 = TPZFMatrix<long_double>::operator()(H,lVar4,lVar14);
          pTVar11 = B;
          lVar22 = lVar21;
          TPZFMatrix<long_double>::ZAXPY(&w,-*plVar6,B);
          B = B + 1;
          lVar19 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = in_ST7;
          in_ST7 = lVar20;
          lVar20 = lVar21;
          lVar21 = lVar22;
        }
        Norm((longdouble *)&w,pTVar11);
        lVar4 = lVar14 + 1;
        plVar6 = TPZFMatrix<long_double>::operator()(H,lVar4,lVar14);
        *plVar6 = lVar19;
        pTVar11 = pTVar10 + lVar4;
        TPZFMatrix<long_double>::operator=(pTVar11,&w);
        TPZFMatrix<long_double>::operator()(H,lVar4,lVar14);
        (*(pTVar11->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x26])(pTVar11);
        lVar15 = 0;
        row = 0;
        while (lVar14 != row) {
          plVar6 = TPZFMatrix<long_double>::operator()(H,row,lVar14);
          row = row + 1;
          plVar7 = TPZFMatrix<long_double>::operator()(H,row,lVar14);
          ApplyPlaneRotation<long_double>
                    (plVar6,plVar7,(longdouble *)((long)cs.fElem + lVar15),
                     (longdouble *)((long)sn.fElem + lVar15));
          lVar15 = lVar15 + 0x10;
        }
        plVar6 = TPZFMatrix<long_double>::operator()(H,lVar14,lVar14);
        plVar7 = TPZFMatrix<long_double>::operator()(H,lVar4,lVar14);
        GeneratePlaneRotation<long_double>(plVar6,plVar7,cs.fElem + lVar14,sn.fElem + lVar14);
        plVar6 = TPZFMatrix<long_double>::operator()(H,lVar14,lVar14);
        plVar7 = TPZFMatrix<long_double>::operator()(H,lVar4,lVar14);
        ApplyPlaneRotation<long_double>(plVar6,plVar7,cs.fElem + lVar14,sn.fElem + lVar14);
        ApplyPlaneRotation<long_double>
                  (s.fElem + lVar14,s.fElem + lVar4,cs.fElem + lVar14,sn.fElem + lVar14);
        lVar19 = s.fElem[lVar4];
        if (*tol <= ABS((double)lVar19) / dVar24) goto code_r0x00cfed25;
        Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>(x,lVar14,H,&s,pTVar10);
        *tol = ABS((double)lVar19) / dVar24;
        *max_iter = lVar12;
        uVar16 = *puVar2 * 0x90;
        uVar23 = uVar16;
        uVar17 = *puVar2;
        while (uVar17 != 0) {
          TPZFMatrix<long_double>::~TPZFMatrix
                    ((TPZFMatrix<long_double> *)((long)puVar2 + (uVar23 - 0x88)));
          uVar23 = uVar23 - 0x90;
          uVar17 = uVar23;
        }
        goto LAB_00cfef39;
      }
      Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>(x,(long)*m + -1,H,&s,pTVar10);
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,this,0);
      pTVar11 = this;
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,this,this,0);
      lVar19 = lVar21;
      Norm((longdouble *)this,pTVar11);
      local_478 = (double)in_ST3;
      local_480 = local_478 / dVar24;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      in_ST7 = lVar20;
      lVar20 = lVar21;
    } while (*tol <= local_480);
    poVar8 = std::operator<<((ostream *)&std::cout,"iter ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::operator<<(poVar8," - ");
    poVar8 = std::ostream::_M_insert<double>(local_480);
    std::endl<char,std::char_traits<char>>(poVar8);
    *tol = local_480;
    *max_iter = lVar12;
    uVar16 = *puVar2 * 0x90;
    uVar23 = uVar16;
    uVar17 = *puVar2;
    while (uVar17 != 0) {
      TPZFMatrix<long_double>::~TPZFMatrix
                ((TPZFMatrix<long_double> *)((long)puVar2 + (uVar23 - 0x88)));
      uVar23 = uVar23 - 0x90;
      uVar17 = uVar23;
    }
LAB_00cfef39:
    operator_delete__(puVar2,uVar16 + 8);
  }
  iVar9 = 0;
LAB_00cfef48:
  TPZFMatrix<long_double>::~TPZFMatrix(&resbackup);
  TPZFMatrix<long_double>::~TPZFMatrix(&w);
  TPZFMatrix<long_double>::~TPZFMatrix(&w1);
  TPZFMatrix<long_double>::~TPZFMatrix(&sn);
  TPZFMatrix<long_double>::~TPZFMatrix(&cs);
  TPZFMatrix<long_double>::~TPZFMatrix(&s);
  return iVar9;
code_r0x00cfed25:
  lVar12 = lVar12 + 1;
  lVar13 = lVar13 + 1;
  lVar14 = lVar4;
  goto LAB_00cfea5f;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}